

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

void cf_h2_proxy_close(Curl_cfilter *cf,Curl_easy *data)

{
  cf_h2_proxy_ctx *ctx;
  Curl_easy *pCVar1;
  Curl_cfilter *pCVar2;
  
  ctx = (cf_h2_proxy_ctx *)cf->ctx;
  if (ctx != (cf_h2_proxy_ctx *)0x0) {
    pCVar1 = (ctx->call_data).data;
    (ctx->call_data).data = data;
    cf_h2_proxy_ctx_clear(ctx);
    *(Curl_easy **)((long)cf->ctx + 8) = pCVar1;
  }
  pCVar2 = cf->next;
  if (pCVar2 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar2->cft->do_close)(pCVar2,data);
    return;
  }
  return;
}

Assistant:

static void cf_h2_proxy_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;

  if(ctx) {
    struct cf_call_data save;

    CF_DATA_SAVE(save, cf, data);
    cf_h2_proxy_ctx_clear(ctx);
    CF_DATA_RESTORE(cf, save);
  }
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}